

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_DEFB(Context *ctx)

{
  char *pcVar1;
  size_t in_RDX;
  char varname [64];
  char acStack_58 [72];
  
  get_GLSL_destarg_varname(ctx,acStack_58,in_RDX);
  push_output(ctx,&ctx->globals);
  pcVar1 = "true";
  if (ctx->dwords[0] == 0) {
    pcVar1 = "false";
  }
  output_line(ctx,"const bool %s = %s;",acStack_58,pcVar1);
  pop_output(ctx);
  return;
}

Assistant:

static void emit_GLSL_DEFB(Context *ctx)
{
    char varname[64]; get_GLSL_destarg_varname(ctx, varname, sizeof (varname));
    push_output(ctx, &ctx->globals);
    output_line(ctx, "const bool %s = %s;",
                varname, ctx->dwords[0] ? "true" : "false");
    pop_output(ctx);
}